

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::Clear(CodeGeneratorResponse *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  CodeGeneratorResponse *local_30;
  CodeGeneratorResponse *this_local;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_30 = this;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::Clear(&this->file_);
  bVar1 = has_error(this);
  if (bVar1) {
    default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    bVar1 = internal::ArenaStringPtr::IsDefault(&this->error_,default_value);
    local_69 = 0;
    if (bVar1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                 ,2000);
      local_69 = 1;
      other = internal::LogMessage::operator<<
                        (&local_68,
                         "CHECK failed: !error_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      internal::LogFinisher::operator=(local_7d,other);
    }
    if ((local_69 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_68);
    }
    internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->error_);
    std::__cxx11::string::clear();
  }
  this_local = (CodeGeneratorResponse *)&this->_has_bits_;
  memset(this_local,0,4);
  local_20 = &this->_internal_metadata_;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_18 = local_20;
    local_10 = local_20;
    internal::InternalMetadataWithArena::DoClear(local_20);
  }
  return;
}

Assistant:

void CodeGeneratorResponse::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorResponse)
  file_.Clear();
  if (has_error()) {
    GOOGLE_DCHECK(!error_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*error_.UnsafeRawStringPointer())->clear();
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}